

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

Rectangle deqp::gles31::Functional::anon_unknown_0::randomViewport
                    (RenderContext *ctx,Random *rnd,GLint maxWidth,GLint maxHeight)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  GLint yOff;
  GLint height;
  GLint xOff;
  GLint width;
  RenderTarget *target;
  GLint maxHeight_local;
  GLint maxWidth_local;
  Random *rnd_local;
  RenderContext *ctx_local;
  RenderTarget *this;
  
  iVar1 = (*ctx->_vptr_RenderContext[4])();
  this = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  iVar1 = tcu::RenderTarget::getWidth(this);
  iVar1 = de::min<int>(iVar1,maxWidth);
  iVar2 = tcu::RenderTarget::getWidth(this);
  iVar2 = de::Random::getInt(rnd,0,iVar2 - iVar1);
  iVar3 = tcu::RenderTarget::getHeight(this);
  iVar3 = de::min<int>(iVar3,maxHeight);
  iVar4 = tcu::RenderTarget::getHeight(this);
  iVar4 = de::Random::getInt(rnd,0,iVar4 - iVar3);
  Rectangle::Rectangle((Rectangle *)&ctx_local,iVar2,iVar4,iVar1,iVar3);
  return _ctx_local;
}

Assistant:

Rectangle randomViewport (const RenderContext& ctx, Random& rnd,
						  GLint maxWidth, GLint maxHeight)
{
	const RenderTarget&	target	= ctx.getRenderTarget();
	GLint				width	= de::min(target.getWidth(), maxWidth);
	GLint				xOff	= rnd.getInt(0, target.getWidth() - width);
	GLint				height	= de::min(target.getHeight(), maxHeight);
	GLint				yOff	= rnd.getInt(0, target.getHeight() - height);

	return Rectangle(xOff, yOff, width, height);
}